

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O1

mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
ising::free_energy::square::
infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *__return_storage_ptr__,square *this,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *beta)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *pmVar4;
  bool bVar5;
  int iVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  invalid_argument *this_00;
  undefined1 *puVar8;
  false_type *pfVar9;
  tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  integrator;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined1 local_588 [12];
  uint uStack_57c;
  uint local_578;
  uint uStack_574;
  uint uStack_570;
  uint uStack_56c;
  uint local_568;
  uint uStack_564;
  int local_560;
  bool local_55c;
  undefined8 local_558;
  tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_548;
  undefined1 local_538 [16];
  uint local_528 [2];
  uint auStack_520 [2];
  uint local_518 [2];
  int local_510;
  bool local_50c;
  undefined8 local_508;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_4f8;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined4 local_4d0;
  undefined1 local_4cc;
  undefined8 local_4c8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *local_4c0;
  cpp_dec_float<50U,_int,_void> local_4b8;
  cpp_dec_float<50U,_int,_void> local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_3f8;
  functor<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_3b8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_2c8;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined4 local_260;
  undefined1 local_25c;
  undefined8 local_258;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_248;
  cpp_dec_float<50U,_int,_void> local_238;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_200;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1c8;
  cpp_dec_float<50U,_int,_void> local_190;
  cpp_dec_float<50U,_int,_void> local_158;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_e8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_a8;
  fvar_t local_68;
  
  puVar8 = &stack0xfffffffffffffa38;
  pfVar9 = (false_type *)Jy;
  bVar5 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                      *)this,(int *)&stack0xfffffffffffffa38);
  if (!bVar5) {
    local_588._0_4_ = 0;
    bVar5 = operator<=(Jx,(int *)local_588);
    if (!bVar5) {
      bVar5 = operator<=(Jy,(int *)&stack0xfffffffffffffa38);
      if (!bVar5) {
        local_4c0 = __return_storage_ptr__;
        if (boost::math::constants::detail::
            constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            ::get_from_string()::result == '\0') {
          iVar6 = __cxa_guard_acquire(&boost::math::constants::detail::
                                       constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                       ::get_from_string()::result);
          if (iVar6 != 0) {
            boost::math::tools::
            convert_from_string<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&boost::math::constants::detail::
                           constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                           ::get_from_string()::result,
                       (tools *)
                       "3.14159265358979323846264338327950288419716939937510582097494459230781640628620899862803482534211706798214808651e+00"
                       ,&stack0xfffffffffffffa38,pfVar9);
            __cxa_guard_release(&boost::math::constants::detail::
                                 constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                 ::get_from_string()::result);
          }
        }
        local_308.base.m_backend.data._M_elems[8] = (uint)DAT_00196d58;
        local_308.base.m_backend.data._M_elems[9] = DAT_00196d58._4_4_;
        local_308.base.m_backend.data._M_elems[4] = _DAT_00196d48;
        local_308.base.m_backend.data._M_elems[5] = _DAT_00196d4c;
        local_308.base.m_backend.data._M_elems[6] = (uint)uRam0000000000196d50;
        local_308.base.m_backend.data._M_elems[7] = uRam0000000000196d50._4_4_;
        local_308.base.m_backend.data._M_elems[0] =
             boost::math::constants::detail::
             constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
             ::get_from_string()::result;
        local_308.base.m_backend.data._M_elems[1] =
             boost::math::constants::detail::
             constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
             ::get_from_string()::result_4;
        local_308.base.m_backend.data._M_elems[2] = (uint)uRam0000000000196d40;
        local_308.base.m_backend.data._M_elems[3] = uRam0000000000196d40._4_4_;
        local_308.base.m_backend.exp = DAT_00196d60;
        local_308.base.m_backend.neg = (bool)DAT_00196d64;
        local_308.base.m_backend.fpclass = (fpclass_type)DAT_00196d68;
        local_308.base.m_backend.prec_elem = DAT_00196d68._4_4_;
        pcVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::min();
        local_538._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
        local_538._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
        local_528 = *(uint (*) [2])((pcVar7->data)._M_elems + 4);
        auStack_520 = *(uint (*) [2])((pcVar7->data)._M_elems + 6);
        local_478.data._M_elems._0_8_ = local_538;
        local_518 = *(uint (*) [2])((pcVar7->data)._M_elems + 8);
        local_510 = pcVar7->exp;
        local_50c = pcVar7->neg;
        local_508._0_4_ = pcVar7->fpclass;
        local_508._4_4_ = pcVar7->prec_elem;
        local_478.data._M_elems[2] = 4;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,int,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_int,_void,_void>
                    *)&local_478,(multiply_immediates *)local_588);
        uStack_570 = 0;
        uStack_56c = 0;
        local_568 = 0;
        uStack_564 = 0;
        local_560 = 0;
        local_55c = false;
        local_558._0_4_ = cpp_dec_float_finite;
        local_558._4_4_ = 10;
        local_548.m_imp.
        super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_588._0_4_ = uVar10;
        local_588._4_4_ = uVar11;
        local_588._8_4_ = uVar12;
        uStack_57c = uVar13;
        local_578 = uVar14;
        uStack_574 = uVar15;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>,std::allocator<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>>,unsigned_long&,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>const&>
                  (&local_548.m_imp.
                    super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                    **)&local_548,
                   (allocator<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>_>
                    *)&local_478,(unsigned_long *)&stack0xfffffffffffffa38,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)local_588);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_158,2,(type *)0x0);
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        boost::multiprecision::default_ops::
        eval_log<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa38,&local_158);
        local_a8.base.m_backend.data._M_elems[8] = 0;
        local_a8.base.m_backend.data._M_elems[9] = 0;
        local_a8.base.m_backend.data._M_elems[1] = uVar11;
        local_a8.base.m_backend.data._M_elems[0] = uVar10;
        local_a8.base.m_backend.data._M_elems[3] = uVar13;
        local_a8.base.m_backend.data._M_elems[2] = uVar12;
        local_a8.base.m_backend.data._M_elems[5] = uVar15;
        local_a8.base.m_backend.data._M_elems[4] = uVar14;
        local_a8.base.m_backend.data._M_elems[6] = 0;
        local_a8.base.m_backend.data._M_elems[7] = 0;
        local_a8.base.m_backend.exp = 0;
        local_a8.base.m_backend.neg = false;
        local_a8.base.m_backend.fpclass = cpp_dec_float_finite;
        local_a8.base.m_backend.prec_elem = 10;
        operator/(&local_120,&local_a8,2);
        local_3f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
        local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
        local_3f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
        local_3f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
        local_3f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
        local_3f8.m_backend.exp = *(int *)(this + 0x28);
        local_3f8.m_backend.neg = *(bool *)(this + 0x2c);
        pfVar9 = (false_type *)CONCAT71((int7)((ulong)puVar8 >> 8),local_3f8.m_backend.neg);
        local_3f8.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
        local_438.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 8);
        local_438.m_backend.data._M_elems._0_8_ = *(undefined8 *)(Jx->base).m_backend.data._M_elems;
        local_438.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 2);
        local_438.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 4);
        local_438.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 6);
        local_438.m_backend.exp = (Jx->base).m_backend.exp;
        local_438.m_backend.neg = (Jx->base).m_backend.neg;
        local_438.m_backend.fpclass = (Jx->base).m_backend.fpclass;
        local_438.m_backend.prec_elem = (Jx->base).m_backend.prec_elem;
        local_2c8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 8);
        local_2c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(Jy->base).m_backend.data._M_elems;
        local_2c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 2);
        local_2c8.m_backend.data._M_elems[4] = (Jy->base).m_backend.data._M_elems[4];
        local_2c8.m_backend.data._M_elems[5] = (Jy->base).m_backend.data._M_elems[5];
        local_2c8.m_backend.data._M_elems[6] = (Jy->base).m_backend.data._M_elems[6];
        local_2c8.m_backend.data._M_elems[7] = (Jy->base).m_backend.data._M_elems[7];
        local_2c8.m_backend.exp = (Jy->base).m_backend.exp;
        local_2c8.m_backend.neg = (Jy->base).m_backend.neg;
        local_2c8.m_backend.fpclass = (Jy->base).m_backend.fpclass;
        local_2c8.m_backend.prec_elem = (Jy->base).m_backend.prec_elem;
        local_3b8.c_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3b8.c_.base.m_backend.prec_elem = 10;
        local_3b8.c_.base.m_backend.data._M_elems[0] = 0;
        local_3b8.c_.base.m_backend.data._M_elems[1] = 0;
        local_3b8.c_.base.m_backend.data._M_elems[2] = 0;
        local_3b8.c_.base.m_backend.data._M_elems[3] = 0;
        local_3b8.c_.base.m_backend.data._M_elems[4] = 0;
        local_3b8.c_.base.m_backend.data._M_elems[5] = 0;
        local_3b8.c_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3b8.c_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3b8.c_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3b8.c_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3b8.c_.base.m_backend.exp = 0;
        local_3b8.c_.base.m_backend.neg = false;
        local_3b8.chab_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3b8.chab_.base.m_backend.prec_elem = 10;
        local_3b8.chab_.base.m_backend.data._M_elems[0] = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[1] = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[2] = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[3] = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[4] = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[5] = 0;
        local_3b8.chab_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3b8.chab_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3b8.chab_.base.m_backend.exp = 0;
        local_3b8.chab_.base.m_backend.neg = false;
        local_3b8.k_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3b8.k_.base.m_backend.prec_elem = 10;
        local_3b8.k_.base.m_backend.data._M_elems[0] = 0;
        local_3b8.k_.base.m_backend.data._M_elems[1] = 0;
        local_3b8.k_.base.m_backend.data._M_elems[2] = 0;
        local_3b8.k_.base.m_backend.data._M_elems[3] = 0;
        local_3b8.k_.base.m_backend.data._M_elems[4] = 0;
        local_3b8.k_.base.m_backend.data._M_elems[5] = 0;
        local_3b8.k_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3b8.k_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3b8.k_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3b8.k_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3b8.k_.base.m_backend.exp = 0;
        local_3b8.k_.base.m_backend.neg = false;
        if (boost::math::constants::detail::
            constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            ::get_from_string()::result == '\0') {
          iVar6 = __cxa_guard_acquire(&boost::math::constants::detail::
                                       constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                       ::get_from_string()::result);
          if (iVar6 != 0) {
            boost::math::tools::
            convert_from_string<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&boost::math::constants::detail::
                           constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                           ::get_from_string()::result,
                       (tools *)
                       "3.14159265358979323846264338327950288419716939937510582097494459230781640628620899862803482534211706798214808651e+00"
                       ,&stack0xfffffffffffffa38,pfVar9);
            __cxa_guard_release(&boost::math::constants::detail::
                                 constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                                 ::get_from_string()::result);
          }
        }
        local_538._0_4_ = 2;
        local_538._8_8_ =
             &boost::math::constants::detail::
              constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ::get_from_string()::result;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_538,(multiply_immediates *)local_588);
        uStack_570 = 0;
        uStack_56c = 0;
        local_568 = 0;
        uStack_564 = 0;
        local_560 = 0;
        local_55c = false;
        local_558._0_4_ = cpp_dec_float_finite;
        local_558._4_4_ = 10;
        local_588._0_4_ = uVar10;
        local_588._4_4_ = uVar11;
        local_588._8_4_ = uVar12;
        uStack_57c = uVar13;
        local_578 = uVar14;
        uStack_574 = uVar15;
        operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa38,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)local_588);
        local_3b8.c_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3b8.c_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3b8.c_.base.m_backend.data._M_elems[1] = uVar11;
        local_3b8.c_.base.m_backend.data._M_elems[0] = uVar10;
        local_3b8.c_.base.m_backend.data._M_elems[3] = uVar13;
        local_3b8.c_.base.m_backend.data._M_elems[2] = uVar12;
        local_3b8.c_.base.m_backend.data._M_elems[5] = uVar15;
        local_3b8.c_.base.m_backend.data._M_elems[4] = uVar14;
        local_3b8.c_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3b8.c_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3b8.c_.base.m_backend.exp = 0;
        local_3b8.c_.base.m_backend.neg = false;
        local_3b8.c_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3b8.c_.base.m_backend.prec_elem = 10;
        local_588._0_4_ = 2;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        unique0x10003a3e = (fvar_t *)&local_2c8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_588,(multiply_immediates *)local_538);
        local_478.data._M_elems[1] = uVar11;
        local_478.data._M_elems[0] = uVar10;
        local_478.data._M_elems[3] = uVar13;
        local_478.data._M_elems[2] = uVar12;
        local_478.data._M_elems[5] = uVar15;
        local_478.data._M_elems[4] = uVar14;
        local_478.data._M_elems[6] = 0;
        local_478.data._M_elems[7] = 0;
        local_478.data._M_elems[8] = 0;
        local_478.data._M_elems[9] = 0;
        local_478.exp = 0;
        local_478.neg = false;
        local_478.fpclass = cpp_dec_float_finite;
        local_478.prec_elem = 10;
        unique0x00005300 = (fvar_t *)&local_3f8;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_588._0_8_ =
             (allocator<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>_>
              *)&local_478;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_588,(multiply_immediates *)local_538);
        local_538._0_8_ = CONCAT44(uVar11,uVar10);
        local_538._8_8_ = CONCAT44(uVar13,uVar12);
        local_528[1] = uVar15;
        local_528[0] = uVar14;
        auStack_520[0] = 0;
        auStack_520[1] = 0;
        local_518[0] = 0;
        local_518[1] = 0;
        local_510 = 0;
        local_50c = false;
        local_508._0_4_ = cpp_dec_float_finite;
        local_508._4_4_ = 10;
        uVar10 = 0;
        uVar12 = 0;
        uVar14 = 0;
        uVar16 = 0;
        uVar18 = 0;
        uVar20 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_538,(cpp_dec_float<50U,_int,_void> *)0x0,
                   (cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa38);
        local_568 = 0;
        uStack_564 = 0;
        uStack_570 = 0;
        uStack_56c = 0;
        local_560 = 0;
        local_55c = false;
        local_558._0_4_ = cpp_dec_float_finite;
        local_558._4_4_ = 10;
        local_4f8.arg1 = (type)CONCAT44(local_4f8.arg1._4_4_,2);
        uVar11 = 0;
        uVar13 = 0;
        uVar15 = 0;
        uVar17 = 0;
        uVar19 = 0;
        uVar21 = 0;
        local_588._0_4_ = uVar10;
        local_588._4_4_ = uVar12;
        local_588._8_4_ = uVar14;
        uStack_57c = uVar16;
        local_578 = uVar18;
        uStack_574 = uVar20;
        local_4f8.arg2 = &local_2c8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_4f8,(multiply_immediates *)&local_4b8);
        local_238.data._M_elems[1] = uVar13;
        local_238.data._M_elems[0] = uVar11;
        local_238.data._M_elems[3] = uVar17;
        local_238.data._M_elems[2] = uVar15;
        local_238.data._M_elems[5] = uVar21;
        local_238.data._M_elems[4] = uVar19;
        local_238.data._M_elems[6] = 0;
        local_238.data._M_elems[7] = 0;
        local_4f8.arg1 = (type)&local_238;
        local_238.data._M_elems[8] = 0;
        local_238.data._M_elems[9] = 0;
        local_238.exp = 0;
        local_238.neg = false;
        local_238.fpclass = cpp_dec_float_finite;
        local_238.prec_elem = 10;
        local_4f8.arg2 = &local_438;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,&local_4f8,(multiply_immediates *)&local_4b8);
        local_4b8.data._M_elems[1] = uVar11;
        local_4b8.data._M_elems[0] = uVar10;
        local_4b8.data._M_elems[3] = uVar13;
        local_4b8.data._M_elems[2] = uVar12;
        local_4b8.data._M_elems[5] = uVar15;
        local_4b8.data._M_elems[4] = uVar14;
        local_4b8.data._M_elems[6] = 0;
        local_4b8.data._M_elems[7] = 0;
        local_4b8.data._M_elems[8] = 0;
        local_4b8.data._M_elems[9] = 0;
        local_4b8.exp = 0;
        local_4b8.neg = false;
        local_4b8.fpclass = cpp_dec_float_finite;
        local_4b8.prec_elem = 10;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_4b8,(cpp_dec_float<50U,_int,_void> *)0x0,
                   (cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa38);
        local_4d8 = 0;
        local_4f8.arg1 = (type)CONCAT44(uVar11,uVar10);
        local_4f8.arg2 = (type)CONCAT44(uVar13,uVar12);
        local_4e8 = CONCAT44(uVar15,uVar14);
        uStack_4e0 = 0;
        local_4d0 = 0;
        local_4cc = 0;
        local_4c8 = 0xa00000000;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_288.arg1 = (type)local_588;
        local_288.arg2 = (type)&local_4f8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,&local_288,(multiply_immediates *)&local_248);
        local_3b8.chab_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[1] = uVar11;
        local_3b8.chab_.base.m_backend.data._M_elems[0] = uVar10;
        local_3b8.chab_.base.m_backend.data._M_elems[3] = uVar13;
        local_3b8.chab_.base.m_backend.data._M_elems[2] = uVar12;
        local_3b8.chab_.base.m_backend.data._M_elems[5] = uVar15;
        local_3b8.chab_.base.m_backend.data._M_elems[4] = uVar14;
        local_3b8.chab_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3b8.chab_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3b8.chab_.base.m_backend.exp = 0;
        local_3b8.chab_.base.m_backend.neg = false;
        local_3b8.chab_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3b8.chab_.base.m_backend.prec_elem = 10;
        local_588._0_4_ = 2;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        unique0x10003a46 = (fvar_t *)&local_2c8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_588,(multiply_immediates *)local_538);
        local_4f8.arg1 = (type)CONCAT44(uVar11,uVar10);
        local_4f8.arg2 = (type)CONCAT44(uVar13,uVar12);
        local_4e8 = CONCAT44(uVar15,uVar14);
        uStack_4e0 = 0;
        local_4d8 = 0;
        local_4d0 = 0;
        local_4cc = 0;
        local_4c8 = 0xa00000000;
        unique0x00005300 = (fvar_t *)&local_3f8;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_588._0_8_ = &local_4f8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_588,(multiply_immediates *)local_538);
        local_478.data._M_elems[1] = uVar11;
        local_478.data._M_elems[0] = uVar10;
        local_478.data._M_elems[3] = uVar13;
        local_478.data._M_elems[2] = uVar12;
        local_478.data._M_elems[5] = uVar15;
        local_478.data._M_elems[4] = uVar14;
        local_478.data._M_elems[6] = 0;
        local_478.data._M_elems[7] = 0;
        local_478.data._M_elems[8] = 0;
        local_478.data._M_elems[9] = 0;
        local_478.exp = 0;
        local_478.neg = false;
        local_478.fpclass = cpp_dec_float_finite;
        local_478.prec_elem = 10;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_478,(cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa38,
                   (cpp_dec_float<50U,_int,_void> *)0x0);
        local_518[0] = 0;
        local_518[1] = 0;
        local_538._0_8_ = CONCAT44(uVar11,uVar10);
        local_538._8_8_ = CONCAT44(uVar13,uVar12);
        local_528[1] = uVar15;
        local_528[0] = uVar14;
        auStack_520[0] = 0;
        auStack_520[1] = 0;
        local_510 = 0;
        local_50c = false;
        local_508._0_4_ = cpp_dec_float_finite;
        local_508._4_4_ = 10;
        local_588._0_4_ = 2;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        unique0x10003a4e = (fvar_t *)&local_2c8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_588,(multiply_immediates *)&local_4b8);
        local_288.arg1 = (type)CONCAT44(uVar11,uVar10);
        local_288.arg2 = (type)CONCAT44(uVar13,uVar12);
        local_278 = CONCAT44(uVar15,uVar14);
        uStack_270 = 0;
        local_268 = 0;
        local_260 = 0;
        local_25c = 0;
        local_258 = 0xa00000000;
        unique0x00005300 = (fvar_t *)&local_438;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_588._0_8_ = &local_288;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_588,(multiply_immediates *)&local_4b8);
        local_238.data._M_elems[1] = uVar11;
        local_238.data._M_elems[0] = uVar10;
        local_238.data._M_elems[3] = uVar13;
        local_238.data._M_elems[2] = uVar12;
        local_238.data._M_elems[5] = uVar15;
        local_238.data._M_elems[4] = uVar14;
        local_238.data._M_elems[6] = 0;
        local_238.data._M_elems[7] = 0;
        local_238.data._M_elems[8] = 0;
        local_238.data._M_elems[9] = 0;
        local_238.exp = 0;
        local_238.neg = false;
        local_238.fpclass = cpp_dec_float_finite;
        local_238.prec_elem = 10;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        boost::multiprecision::default_ops::detail::
        sinhcosh<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_238,(cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa38,
                   (cpp_dec_float<50U,_int,_void> *)0x0);
        local_4b8.data._M_elems[8] = 0;
        local_4b8.data._M_elems[9] = 0;
        local_4b8.data._M_elems[1] = uVar11;
        local_4b8.data._M_elems[0] = uVar10;
        local_4b8.data._M_elems[3] = uVar13;
        local_4b8.data._M_elems[2] = uVar12;
        local_4b8.data._M_elems[5] = uVar15;
        local_4b8.data._M_elems[4] = uVar14;
        local_4b8.data._M_elems[6] = 0;
        local_4b8.data._M_elems[7] = 0;
        local_4b8.exp = 0;
        local_4b8.neg = false;
        local_4b8.fpclass = cpp_dec_float_finite;
        local_4b8.prec_elem = 10;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_248.arg1 = (type)local_538;
        local_248.arg2 = (type)&local_4b8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,&local_248,(multiply_immediates *)local_588);
        uStack_570 = 0;
        uStack_56c = 0;
        local_568 = 0;
        uStack_564 = 0;
        local_560 = 0;
        local_55c = false;
        local_558._0_4_ = cpp_dec_float_finite;
        local_558._4_4_ = 10;
        local_588._0_4_ = uVar10;
        local_588._4_4_ = uVar11;
        local_588._8_4_ = uVar12;
        uStack_57c = uVar13;
        local_578 = uVar14;
        uStack_574 = uVar15;
        operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa38,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)local_588);
        local_3b8.k_.base.m_backend.data._M_elems._32_5_ = 0;
        local_3b8.k_.base.m_backend.data._M_elems[9]._1_3_ = 0;
        local_3b8.k_.base.m_backend.data._M_elems[1] = uVar11;
        local_3b8.k_.base.m_backend.data._M_elems[0] = uVar10;
        local_3b8.k_.base.m_backend.data._M_elems[3] = uVar13;
        local_3b8.k_.base.m_backend.data._M_elems[2] = uVar12;
        local_3b8.k_.base.m_backend.data._M_elems[5] = uVar15;
        local_3b8.k_.base.m_backend.data._M_elems[4] = uVar14;
        local_3b8.k_.base.m_backend.data._M_elems._24_5_ = 0;
        local_3b8.k_.base.m_backend.data._M_elems[7]._1_3_ = 0;
        local_3b8.k_.base.m_backend.exp = 0;
        local_3b8.k_.base.m_backend.neg = false;
        local_3b8.k_.base.m_backend.fpclass = cpp_dec_float_finite;
        local_3b8.k_.base.m_backend.prec_elem = 10;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_190,0,(type *)0x0);
        operator/(&local_1c8,&local_308,2);
        pcVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::eps();
        uVar1 = *(undefined8 *)(pcVar7->data)._M_elems;
        uVar2 = *(undefined8 *)((pcVar7->data)._M_elems + 2);
        uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 4);
        uVar14 = (uint)uVar3;
        uVar15 = (uint)((ulong)uVar3 >> 0x20);
        uVar10 = (uint)uVar1;
        uVar11 = (uint)((ulong)uVar1 >> 0x20);
        uVar12 = (uint)uVar2;
        uVar13 = (uint)((ulong)uVar2 >> 0x20);
        sqrt<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  (&local_200,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&stack0xfffffffffffffa38);
        boost::math::quadrature::
        tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
        ::
        integrate<ising::free_energy::square::(anonymous_namespace)::functor<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                  (&local_68,&local_548,&local_3b8,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_190,&local_1c8,&local_200,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(uVar11,uVar10),
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(uVar13,uVar12),(size_t *)CONCAT44(uVar15,uVar14));
        local_588._0_4_ = 2;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        unique0x10003a36 = &local_68;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_588,(multiply_immediates *)local_538);
        local_e8.m_backend.data._M_elems[1] = uVar11;
        local_e8.m_backend.data._M_elems[0] = uVar10;
        local_e8.m_backend.data._M_elems[3] = uVar13;
        local_e8.m_backend.data._M_elems[2] = uVar12;
        local_e8.m_backend.data._M_elems[5] = uVar15;
        local_e8.m_backend.data._M_elems[4] = uVar14;
        local_e8.m_backend.data._M_elems[6] = 0;
        local_e8.m_backend.data._M_elems[7] = 0;
        local_538._8_8_ = &local_e8;
        local_e8.m_backend.data._M_elems[8] = 0;
        local_e8.m_backend.data._M_elems[9] = 0;
        local_e8.m_backend.exp = 0;
        local_e8.m_backend.neg = false;
        local_e8.m_backend.fpclass = cpp_dec_float_finite;
        local_e8.m_backend.prec_elem = 10;
        local_538._0_8_ = &local_120;
        uVar10 = 0;
        uVar12 = 0;
        uVar14 = 0;
        uVar16 = 0;
        uVar18 = 0;
        uVar20 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&stack0xfffffffffffffa38,
                   (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_538,(add_immediates *)local_588);
        uStack_564 = 0;
        local_560 = 0;
        uStack_56c = 0;
        uStack_570 = 0;
        local_568 = 0;
        local_55c = uVar10 != 0;
        local_558._0_4_ = cpp_dec_float_finite;
        local_558._4_4_ = 10;
        uVar11 = 0;
        uVar13 = 0;
        uVar15 = 0;
        uVar17 = 0;
        uVar19 = 0;
        uVar21 = 0;
        local_588._0_4_ = uVar10;
        local_588._4_4_ = uVar12;
        local_588._8_4_ = uVar14;
        uStack_57c = uVar16;
        local_578 = uVar18;
        uStack_574 = uVar20;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)&stack0xfffffffffffffa38,
                   (cpp_dec_float<50U,_int,_void> *)local_588,(cpp_dec_float<50U,_int,_void> *)Jy);
        pmVar4 = local_4c0;
        pcVar7 = &(local_4c0->base).m_backend;
        (pcVar7->data)._M_elems[8] = 0;
        (pcVar7->data)._M_elems[9] = 0;
        *(ulong *)((local_4c0->base).m_backend.data._M_elems + 4) = CONCAT44(uVar21,uVar19);
        pcVar7 = &(local_4c0->base).m_backend;
        (pcVar7->data)._M_elems[6] = 0;
        (pcVar7->data)._M_elems[7] = 0;
        *(ulong *)(local_4c0->base).m_backend.data._M_elems = CONCAT44(uVar13,uVar11);
        *(ulong *)((local_4c0->base).m_backend.data._M_elems + 2) = CONCAT44(uVar17,uVar15);
        (local_4c0->base).m_backend.exp = 0;
        (local_4c0->base).m_backend.neg = false;
        (local_4c0->base).m_backend.fpclass = cpp_dec_float_finite;
        (local_4c0->base).m_backend.prec_elem = 10;
        if (local_548.m_imp.
            super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_548.m_imp.
                     super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        return pmVar4;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"beta should be positive");
      goto LAB_0013822d;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Jx and Jy should be positive");
LAB_0013822d:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Jx, T Jy, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  boost::math::quadrature::tanh_sinh<real_t> integrator;
  auto logZ = log(real_t(2)) / 2 +
              2 * integrator.integrate(func(Jx, Jy, beta), 0, pi / 2);
  return -logZ / beta;
}